

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.hpp
# Opt level: O3

void __thiscall duckdb::CSVError::~CSVError(CSVError *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->csv_row)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->csv_row).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->full_error_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->full_error_message).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->error_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->error_message).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

CSVError() {}